

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O2

VarBranch FlatZinc::ann2ivarsel(Node *ann)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  if ((ann != (Node *)0x0) &&
     (lVar2 = __dynamic_cast(ann,&AST::Node::typeinfo,&AST::Atom::typeinfo,0), lVar2 != 0)) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 8);
    bVar1 = std::operator==(__lhs,"input_order");
    if (bVar1) {
      return VAR_INORDER;
    }
    bVar1 = std::operator==(__lhs,"first_fail");
    if (bVar1) {
      return VAR_SIZE_MIN;
    }
    bVar1 = std::operator==(__lhs,"anti_first_fail");
    if (bVar1) {
      return VAR_SIZE_MAX;
    }
    bVar1 = std::operator==(__lhs,"smallest");
    if (bVar1) {
      return VAR_MIN_MIN;
    }
    bVar1 = std::operator==(__lhs,"smallest_largest");
    if (bVar1) {
      return VAR_MAX_MIN;
    }
    bVar1 = std::operator==(__lhs,"largest");
    if (bVar1) {
      return VAR_MAX_MAX;
    }
    bVar1 = std::operator==(__lhs,"largest_smallest");
    if (bVar1) {
      return VAR_MIN_MAX;
    }
    bVar1 = std::operator==(__lhs,"occurrence");
    if (bVar1) {
      return VAR_DEGREE_MAX;
    }
    bVar1 = std::operator==(__lhs,"most_constrained");
    if (bVar1) {
      return VAR_SIZE_MIN;
    }
    bVar1 = std::operator==(__lhs,"max_regret");
    if (bVar1) {
      return VAR_REGRET_MIN_MAX;
    }
    bVar1 = std::operator==(__lhs,"random_order");
    if (bVar1) {
      return VAR_RANDOM;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "% Warning: Unknown or not support variable selection annotation \'");
  (*ann->_vptr_Node[2])(ann,&std::cerr);
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "\'! Ignore variable selection annotation and replace it by \'input_order\'."
                          );
  std::operator<<(poVar3,'\n');
  return VAR_INORDER;
}

Assistant:

VarBranch ann2ivarsel(AST::Node* ann) {
	if (auto* s = dynamic_cast<AST::Atom*>(ann)) {
		if (s->id == "input_order") {
			return VAR_INORDER;
		}
		if (s->id == "first_fail") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "anti_first_fail") {
			return VAR_SIZE_MAX;
		}
		if (s->id == "smallest") {
			return VAR_MIN_MIN;
		}
		if (s->id == "smallest_largest") {
			return VAR_MAX_MIN;
		}
		if (s->id == "largest") {
			return VAR_MAX_MAX;
		}
		if (s->id == "largest_smallest") {
			return VAR_MIN_MAX;
		}
		if (s->id == "occurrence") {
			return VAR_DEGREE_MAX;
		}
		if (s->id == "most_constrained") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "max_regret") {
			return VAR_REGRET_MIN_MAX;
		}
		if (s->id == "random_order") {
			return VAR_RANDOM;
		}
#ifdef HAS_VAR_IMPACT
		if (s->id == "impact") return VAR_IMPACT;
#endif
	}
	std::cerr << "% Warning: Unknown or not support variable selection annotation '";
	ann->print(std::cerr);
	std::cerr << "'! Ignore variable selection annotation and replace it by 'input_order'." << '\n';
	return VAR_INORDER;
}